

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(cmOrderDirectories *this)

{
  if (this->Computed == false) {
    this->Computed = true;
    CollectOriginalDirectories(this);
    FindConflicts(this);
    OrderDirectories(this);
  }
  return &this->OrderedDirectories;
}

Assistant:

std::vector<std::string> const& cmOrderDirectories::GetOrderedDirectories()
{
  if(!this->Computed)
    {
    this->Computed = true;
    this->CollectOriginalDirectories();
    this->FindConflicts();
    this->OrderDirectories();
    }
  return this->OrderedDirectories;
}